

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucci.cpp
# Opt level: O0

CommEnum IdleLine(CommDetail *Command,int Debug)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  size_t sVar4;
  int in_ESI;
  long *in_RDI;
  CommEnum RetValue;
  char *LineStr;
  CommEnum local_24;
  char *local_20;
  int local_14;
  long *local_10;
  CommEnum local_4;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_20 = ReadInput();
  while (local_20 == (char *)0x0) {
    Idle();
    local_20 = ReadInput();
  }
  if (local_14 != 0) {
    printf("info string %s\n",local_20);
    fflush(_stdout);
  }
  iVar3 = strcmp(local_20,"isready");
  if (iVar3 == 0) {
    local_4 = e_CommIsReady;
  }
  else {
    iVar3 = strncmp(local_20,"setoption ",10);
    if (iVar3 == 0) {
      local_20 = local_20 + 10;
      iVar3 = strncmp(local_20,"batch ",6);
      if (iVar3 == 0) {
        local_20 = local_20 + 6;
        *(undefined4 *)local_10 = 1;
        iVar3 = strncmp(local_20,"on",2);
        if (iVar3 == 0) {
          *(undefined4 *)(local_10 + 1) = 1;
        }
        else {
          iVar3 = strncmp(local_20,"true",4);
          if (iVar3 == 0) {
            *(undefined4 *)(local_10 + 1) = 1;
          }
          else {
            *(undefined4 *)(local_10 + 1) = 0;
          }
        }
      }
      else {
        iVar3 = strncmp(local_20,"debug ",6);
        if (iVar3 == 0) {
          local_20 = local_20 + 6;
          *(undefined4 *)local_10 = 2;
          iVar3 = strncmp(local_20,"on",2);
          if (iVar3 == 0) {
            *(undefined4 *)(local_10 + 1) = 1;
          }
          else {
            iVar3 = strncmp(local_20,"true",4);
            if (iVar3 == 0) {
              *(undefined4 *)(local_10 + 1) = 1;
            }
            else {
              *(undefined4 *)(local_10 + 1) = 0;
            }
          }
        }
        else {
          iVar3 = strncmp(local_20,"bookfiles ",10);
          if (iVar3 == 0) {
            *(undefined4 *)local_10 = 3;
            local_10[1] = (long)(local_20 + 10);
          }
          else {
            iVar3 = strncmp(local_20,"egtbpaths ",10);
            if (iVar3 == 0) {
              *(undefined4 *)local_10 = 4;
              local_10[1] = (long)(local_20 + 10);
            }
            else {
              iVar3 = strncmp(local_20,"hashsize ",9);
              if (iVar3 == 0) {
                local_20 = local_20 + 9;
                *(undefined4 *)local_10 = 5;
                iVar3 = ReadDigit(&local_20,0x400);
                *(int *)(local_10 + 1) = iVar3;
              }
              else {
                iVar3 = strncmp(local_20,"threads ",8);
                if (iVar3 == 0) {
                  local_20 = local_20 + 8;
                  *(undefined4 *)local_10 = 6;
                  iVar3 = ReadDigit(&local_20,0x20);
                  *(int *)(local_10 + 1) = iVar3;
                }
                else {
                  iVar3 = strncmp(local_20,"drawmoves ",10);
                  if (iVar3 == 0) {
                    local_20 = local_20 + 10;
                    *(undefined4 *)local_10 = 7;
                    iVar3 = ReadDigit(&local_20,200);
                    *(int *)(local_10 + 1) = iVar3;
                  }
                  else {
                    iVar3 = strncmp(local_20,"repetition ",0xb);
                    if (iVar3 == 0) {
                      local_20 = local_20 + 0xb;
                      *(undefined4 *)local_10 = 8;
                      iVar3 = strncmp(local_20,"alwaysdraw",10);
                      if (iVar3 == 0) {
                        *(undefined4 *)(local_10 + 1) = 0;
                      }
                      else {
                        iVar3 = strncmp(local_20,"checkban",8);
                        if (iVar3 == 0) {
                          *(undefined4 *)(local_10 + 1) = 1;
                        }
                        else {
                          iVar3 = strncmp(local_20,"asianrule",9);
                          if (iVar3 == 0) {
                            *(undefined4 *)(local_10 + 1) = 2;
                          }
                          else {
                            iVar3 = strncmp(local_20,"chineserule",0xb);
                            if (iVar3 == 0) {
                              *(undefined4 *)(local_10 + 1) = 3;
                            }
                            else {
                              *(undefined4 *)(local_10 + 1) = 3;
                            }
                          }
                        }
                      }
                    }
                    else {
                      iVar3 = strncmp(local_20,"pruning ",8);
                      if (iVar3 == 0) {
                        local_20 = local_20 + 8;
                        *(undefined4 *)local_10 = 9;
                        iVar3 = strncmp(local_20,"none",4);
                        if (iVar3 == 0) {
                          *(undefined4 *)(local_10 + 1) = 0;
                        }
                        else {
                          iVar3 = strncmp(local_20,"small",5);
                          if (iVar3 == 0) {
                            *(undefined4 *)(local_10 + 1) = 1;
                          }
                          else {
                            iVar3 = strncmp(local_20,"medium",6);
                            if (iVar3 == 0) {
                              *(undefined4 *)(local_10 + 1) = 2;
                            }
                            else {
                              iVar3 = strncmp(local_20,"large",5);
                              if (iVar3 == 0) {
                                *(undefined4 *)(local_10 + 1) = 3;
                              }
                              else {
                                *(undefined4 *)(local_10 + 1) = 3;
                              }
                            }
                          }
                        }
                      }
                      else {
                        iVar3 = strncmp(local_20,"knowledge ",10);
                        if (iVar3 == 0) {
                          local_20 = local_20 + 10;
                          *(undefined4 *)local_10 = 10;
                          iVar3 = strncmp(local_20,"none",4);
                          if (iVar3 == 0) {
                            *(undefined4 *)(local_10 + 1) = 0;
                          }
                          else {
                            iVar3 = strncmp(local_20,"small",5);
                            if (iVar3 == 0) {
                              *(undefined4 *)(local_10 + 1) = 1;
                            }
                            else {
                              iVar3 = strncmp(local_20,"medium",6);
                              if (iVar3 == 0) {
                                *(undefined4 *)(local_10 + 1) = 2;
                              }
                              else {
                                iVar3 = strncmp(local_20,"large",5);
                                if (iVar3 == 0) {
                                  *(undefined4 *)(local_10 + 1) = 3;
                                }
                                else {
                                  *(undefined4 *)(local_10 + 1) = 3;
                                }
                              }
                            }
                          }
                        }
                        else {
                          iVar3 = strncmp(local_20,"selectivity ",0xc);
                          if (iVar3 == 0) {
                            local_20 = local_20 + 0xc;
                            *(undefined4 *)local_10 = 0xb;
                            iVar3 = strncmp(local_20,"none",4);
                            if (iVar3 == 0) {
                              *(undefined4 *)(local_10 + 1) = 0;
                            }
                            else {
                              iVar3 = strncmp(local_20,"small",5);
                              if (iVar3 == 0) {
                                *(undefined4 *)(local_10 + 1) = 1;
                              }
                              else {
                                iVar3 = strncmp(local_20,"medium",6);
                                if (iVar3 == 0) {
                                  *(undefined4 *)(local_10 + 1) = 2;
                                }
                                else {
                                  iVar3 = strncmp(local_20,"large",5);
                                  if (iVar3 == 0) {
                                    *(undefined4 *)(local_10 + 1) = 3;
                                  }
                                  else {
                                    *(undefined4 *)(local_10 + 1) = 0;
                                  }
                                }
                              }
                            }
                          }
                          else {
                            iVar3 = strncmp(local_20,"style ",6);
                            if (iVar3 == 0) {
                              local_20 = local_20 + 6;
                              *(undefined4 *)local_10 = 0xc;
                              iVar3 = strncmp(local_20,"solid",5);
                              if (iVar3 == 0) {
                                *(undefined4 *)(local_10 + 1) = 0;
                              }
                              else {
                                iVar3 = strncmp(local_20,"normal",6);
                                if (iVar3 == 0) {
                                  *(undefined4 *)(local_10 + 1) = 1;
                                }
                                else {
                                  iVar3 = strncmp(local_20,"risky",5);
                                  if (iVar3 == 0) {
                                    *(undefined4 *)(local_10 + 1) = 2;
                                  }
                                  else {
                                    *(undefined4 *)(local_10 + 1) = 1;
                                  }
                                }
                              }
                            }
                            else {
                              iVar3 = strncmp(local_20,"loadbook",8);
                              if (iVar3 == 0) {
                                *(undefined4 *)local_10 = 0xd;
                              }
                              else {
                                iVar3 = strncmp(local_20,"newgame",7);
                                if (iVar3 == 0) {
                                  *(undefined4 *)local_10 = 0xe;
                                }
                                else {
                                  *(undefined4 *)local_10 = 0;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_4 = e_CommSetOption;
    }
    else {
      iVar3 = strncmp(local_20,"position ",9);
      if (iVar3 == 0) {
        local_20 = local_20 + 9;
        iVar3 = strncmp(local_20,"startpos",8);
        if (iVar3 == 0) {
          *local_10 = (long)"rnbakabnr/9/1c5c1/p1p1p1p1p/9/9/P1P1P1P1P/1C5C1/9/RNBAKABNR w - - 0 1";
        }
        else {
          iVar3 = strncmp(local_20,"midgamepos",10);
          if (iVar3 == 0) {
            *local_10 = (long)
                        "2bakab1r/6r2/1cn4c1/p1p1p3p/9/2P3p2/PC2P1n1P/2N1B1NC1/R4R3/3AKAB2 w - - 0 1"
            ;
          }
          else {
            iVar3 = strncmp(local_20,"checkmatepos",0xc);
            if (iVar3 == 0) {
              *local_10 = (long)"4kar2/4a2rn/4bc3/RN1c5/2bC5/9/4p4/9/4p4/3p1K3 w - - 0 1";
            }
            else {
              iVar3 = strncmp(local_20,"zugzwangpos",0xb);
              if (iVar3 == 0) {
                *local_10 = (long)"3k5/4PP3/4r4/3P5/9/9/9/9/9/5K3 w - - 0 1";
              }
              else {
                iVar3 = strncmp(local_20,"endgamepos",10);
                if (iVar3 == 0) {
                  *local_10 = (long)"4k4/4a4/4P4/9/9/9/9/4B4/9/4K4 w - - 0 1";
                }
                else {
                  iVar3 = strncmp(local_20,"fen ",4);
                  if (iVar3 != 0) {
                    return e_CommNone;
                  }
                  *local_10 = (long)(local_20 + 4);
                }
              }
            }
          }
        }
        for (; *local_20 != '\0'; local_20 = local_20 + 1) {
          iVar3 = strncmp(local_20," moves ",7);
          if (iVar3 == 0) {
            local_20 = local_20 + 7;
            sVar4 = strlen(local_20);
            auVar1._8_8_ = 0;
            auVar1._0_8_ = sVar4 + 1;
            *(int *)(local_10 + 1) = SUB164(auVar1 / ZEXT816(5),0);
            local_10[2] = (long)local_20;
            return e_CommPosition;
          }
        }
        *(undefined4 *)(local_10 + 1) = 0;
        local_10[2] = 0;
        local_4 = e_CommPosition;
      }
      else {
        iVar3 = strncmp(local_20,"banmoves ",9);
        if (iVar3 == 0) {
          local_20 = local_20 + 9;
          sVar4 = strlen(local_20);
          auVar2._8_8_ = 0;
          auVar2._0_8_ = sVar4 + 1;
          *(int *)local_10 = SUB164(auVar2 / ZEXT816(5),0);
          local_10[1] = (long)local_20;
          local_4 = e_CommBanMoves;
        }
        else {
          iVar3 = strncmp(local_20,"go ",3);
          if (iVar3 == 0) {
            local_20 = local_20 + 3;
            iVar3 = strncmp(local_20,"ponder ",7);
            if (iVar3 == 0) {
              local_20 = local_20 + 7;
              local_24 = e_CommGoPonder;
            }
            else {
              local_24 = e_CommGo;
            }
            iVar3 = strncmp(local_20,"time ",5);
            if (iVar3 == 0) {
              local_20 = local_20 + 5;
              iVar3 = ReadDigit(&local_20,36000);
              *(int *)((long)local_10 + 4) = iVar3;
              iVar3 = strncmp(local_20," movestogo ",0xb);
              if (iVar3 == 0) {
                local_20 = local_20 + 0xb;
                *(undefined4 *)local_10 = 1;
                iVar3 = ReadDigit(&local_20,100);
                *(int *)(local_10 + 1) = iVar3;
                if ((int)local_10[1] < 1) {
                  *(undefined4 *)(local_10 + 1) = 1;
                }
              }
              else {
                iVar3 = strncmp(local_20," increment ",0xb);
                if (iVar3 == 0) {
                  local_20 = local_20 + 0xb;
                  *(undefined4 *)local_10 = 2;
                  iVar3 = ReadDigit(&local_20,600);
                  *(int *)(local_10 + 1) = iVar3;
                }
                else {
                  *(undefined4 *)local_10 = 1;
                  *(undefined4 *)(local_10 + 1) = 1;
                }
              }
            }
            else {
              iVar3 = strncmp(local_20,"depth ",6);
              if (iVar3 == 0) {
                local_20 = local_20 + 6;
                *(undefined4 *)local_10 = 0;
                iVar3 = ReadDigit(&local_20,0x1f);
                *(int *)((long)local_10 + 4) = iVar3;
              }
              else {
                *(undefined4 *)local_10 = 0;
                *(undefined4 *)((long)local_10 + 4) = 0x1f;
              }
            }
            local_4 = local_24;
          }
          else {
            iVar3 = strcmp(local_20,"stop");
            if (iVar3 == 0) {
              local_4 = e_CommStop;
            }
            else {
              iVar3 = strcmp(local_20,"quit");
              if (iVar3 == 0) {
                local_4 = e_CommQuit;
              }
              else {
                iVar3 = strncmp(local_20,"//",2);
                if (iVar3 == 0) {
                  *local_10 = (long)local_20;
                  local_4 = e_CommAnnotation;
                }
                else {
                  local_4 = e_CommNone;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

CommEnum IdleLine(CommDetail &Command, int /* bool */ Debug) {
    const char *LineStr;
    CommEnum RetValue;
    LineStr = ReadInput();
    while (LineStr == NULL) {
        Idle();
        LineStr = ReadInput();
    }
    if (Debug) {
        printf("info string %s\n", LineStr);
        fflush(stdout);
    }
    // "IdleLine()"是最复杂的UCCI指令解释器，大多数的UCCI指令都由它来解释，包括：

    // 1. "isready"指令
    if (strcmp(LineStr, "isready") == 0) {
        return e_CommIsReady;

        // 2. "setoption <option> [<arguments>]"指令
    } else if (strncmp(LineStr, "setoption ", 10) == 0) {
        LineStr += 10;

        // (i) "batch"选项
        if (strncmp(LineStr, "batch ", 6) == 0) {
            LineStr += 6;
            Command.Option.Type = e_OptionBatch;
            if (strncmp(LineStr, "on", 2) == 0) {
                Command.Option.Value.Check = e_CheckTrue;
            } else if (strncmp(LineStr, "true", 4) == 0) {
                Command.Option.Value.Check = e_CheckTrue;
            } else {
                Command.Option.Value.Check = e_CheckFalse;
            } // 由于"batch"选项默认是关闭的，所以只有设定"on"或"true"时才打开，下同

            // (ii) "debug"选项
        } else if (strncmp(LineStr, "debug ", 6) == 0) {
            LineStr += 6;
            Command.Option.Type = e_OptionDebug;
            if (strncmp(LineStr, "on", 2) == 0) {
                Command.Option.Value.Check = e_CheckTrue;
            } else if (strncmp(LineStr, "true", 4) == 0) {
                Command.Option.Value.Check = e_CheckTrue;
            } else {
                Command.Option.Value.Check = e_CheckFalse;
            }

            // (iii) "bookfiles"选项
        } else if (strncmp(LineStr, "bookfiles ", 10) == 0) {
            Command.Option.Type = e_OptionBookFiles;
            Command.Option.Value.String = LineStr + 10;

            // (iv) "egtbpaths"选项
        } else if (strncmp(LineStr, "egtbpaths ", 10) == 0) {
            Command.Option.Type = e_OptionEgtbPaths;
            Command.Option.Value.String = LineStr + 10;

            // (v) "hashsize"选项
        } else if (strncmp(LineStr, "hashsize ", 9) == 0) {
            LineStr += 9;
            Command.Option.Type = e_OptionHashSize;
            Command.Option.Value.Spin = ReadDigit(LineStr, 1024);

            // (vi) "threads"选项
        } else if (strncmp(LineStr, "threads ", 8) == 0) {
            LineStr += 8;
            Command.Option.Type = e_OptionThreads;
            Command.Option.Value.Spin = ReadDigit(LineStr, 32);

            // (vii) "drawmoves"选项
        } else if (strncmp(LineStr, "drawmoves ", 10) == 0) {
            LineStr += 10;
            Command.Option.Type = e_OptionDrawMoves;
            Command.Option.Value.Spin = ReadDigit(LineStr, 200);

            // (viii) "repetition"选项
        } else if (strncmp(LineStr, "repetition ", 11) == 0) {
            LineStr += 11;
            Command.Option.Type = e_OptionRepetition;
            if (strncmp(LineStr, "alwaysdraw", 10) == 0) {
                Command.Option.Value.Repetition = e_RepetitionAlwaysDraw;
            } else if (strncmp(LineStr, "checkban", 8) == 0) {
                Command.Option.Value.Repetition = e_RepetitionCheckBan;
            } else if (strncmp(LineStr, "asianrule", 9) == 0) {
                Command.Option.Value.Repetition = e_RepetitionAsianRule;
            } else if (strncmp(LineStr, "chineserule", 11) == 0) {
                Command.Option.Value.Repetition = e_RepetitionChineseRule;
            } else {
                Command.Option.Value.Repetition = e_RepetitionChineseRule;
            }

            // (ix) "pruning"选项
        } else if (strncmp(LineStr, "pruning ", 8) == 0) {
            LineStr += 8;
            Command.Option.Type = e_OptionPruning;
            if (strncmp(LineStr, "none", 4) == 0) {
                Command.Option.Value.Scale = e_ScaleNone;
            } else if (strncmp(LineStr, "small", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleSmall;
            } else if (strncmp(LineStr, "medium", 6) == 0) {
                Command.Option.Value.Scale = e_ScaleMedium;
            } else if (strncmp(LineStr, "large", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleLarge;
            } else {
                Command.Option.Value.Scale = e_ScaleLarge;
            }

            // (x) "knowledge"选项
        } else if (strncmp(LineStr, "knowledge ", 10) == 0) {
            LineStr += 10;
            Command.Option.Type = e_OptionKnowledge;
            if (strncmp(LineStr, "none", 4) == 0) {
                Command.Option.Value.Scale = e_ScaleNone;
            } else if (strncmp(LineStr, "small", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleSmall;
            } else if (strncmp(LineStr, "medium", 6) == 0) {
                Command.Option.Value.Scale = e_ScaleMedium;
            } else if (strncmp(LineStr, "large", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleLarge;
            } else {
                Command.Option.Value.Scale = e_ScaleLarge;
            }

            // (xi) "selectivity"选项
        } else if (strncmp(LineStr, "selectivity ", 12) == 0) {
            LineStr += 12;
            Command.Option.Type = e_OptionSelectivity;
            if (strncmp(LineStr, "none", 4) == 0) {
                Command.Option.Value.Scale = e_ScaleNone;
            } else if (strncmp(LineStr, "small", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleSmall;
            } else if (strncmp(LineStr, "medium", 6) == 0) {
                Command.Option.Value.Scale = e_ScaleMedium;
            } else if (strncmp(LineStr, "large", 5) == 0) {
                Command.Option.Value.Scale = e_ScaleLarge;
            } else {
                Command.Option.Value.Scale = e_ScaleNone;
            }

            // (xii) "style"选项
        } else if (strncmp(LineStr, "style ", 6) == 0) {
            LineStr += 6;
            Command.Option.Type = e_OptionStyle;
            if (strncmp(LineStr, "solid", 5) == 0) {
                Command.Option.Value.Style = e_StyleSolid;
            } else if (strncmp(LineStr, "normal", 6) == 0) {
                Command.Option.Value.Style = e_StyleNormal;
            } else if (strncmp(LineStr, "risky", 5) == 0) {
                Command.Option.Value.Style = e_StyleRisky;
            } else {
                Command.Option.Value.Style = e_StyleNormal;
            }

            // (xiii) "loadbook"选项
        } else if (strncmp(LineStr, "loadbook", 8) == 0) {
            Command.Option.Type = e_OptionLoadBook;

            // (xiv) 无法识别的选项，有扩充的余地
        } else if (strncmp(LineStr, "newgame", 7) == 0){
            Command.Option.Type = e_NewGame;
            //开始新一轮比赛或挑战
        } else {
            Command.Option.Type = e_OptionNone;
        }
        return e_CommSetOption;

        // 3. "position {<special_position> | fen <fen_string>} [moves <move_list>]"指令
    } else if (strncmp(LineStr, "position ", 9) == 0) {
        LineStr += 9;

        // 首先判断是否是特殊局面(这里规定了5种)，是特殊局面就直接转换成对应的FEN串
        if (strncmp(LineStr, "startpos", 8) == 0) {
            Command.Position.FenStr = "rnbakabnr/9/1c5c1/p1p1p1p1p/9/9/P1P1P1P1P/1C5C1/9/RNBAKABNR w - - 0 1";
        } else if (strncmp(LineStr, "midgamepos", 10) == 0) {
            Command.Position.FenStr = "2bakab1r/6r2/1cn4c1/p1p1p3p/9/2P3p2/PC2P1n1P/2N1B1NC1/R4R3/3AKAB2 w - - 0 1";
        } else if (strncmp(LineStr, "checkmatepos", 12) == 0) {
            Command.Position.FenStr = "4kar2/4a2rn/4bc3/RN1c5/2bC5/9/4p4/9/4p4/3p1K3 w - - 0 1";
        } else if (strncmp(LineStr, "zugzwangpos", 11) == 0) {
            Command.Position.FenStr = "3k5/4PP3/4r4/3P5/9/9/9/9/9/5K3 w - - 0 1";
        } else if (strncmp(LineStr, "endgamepos", 10) == 0) {
            Command.Position.FenStr = "4k4/4a4/4P4/9/9/9/9/4B4/9/4K4 w - - 0 1";
            // 然后判断是否指定了FEN串
        } else if (strncmp(LineStr, "fen ", 4) == 0) {
            Command.Position.FenStr = LineStr + 4;
            // 如果两者都不是，就立即返回
        } else {
            return e_CommNone;
        }
        // 然后寻找是否指定了后续着法，即是否有"moves"关键字
        while (*LineStr != '\0') {
            if (strncmp(LineStr, " moves ", 7) == 0) {
                LineStr += 7;
                Command.Position.MoveNum = int((strlen(LineStr) + 1) / 5); // 提示："moves"后面的每个着法都是4个字符和1个空格
                Command.Position.MoveStr = LineStr;
                return e_CommPosition;
            }
            LineStr ++;
        }
        Command.Position.MoveNum = 0;
        Command.Position.MoveStr = NULL;
        return e_CommPosition;

        // 4. "banmoves <move_list>"指令，处理起来和"position ... moves ..."是一样的
    } else if (strncmp(LineStr, "banmoves ", 9) == 0) {
        LineStr += 9;
        Command.BanMoves.MoveNum = int((strlen(LineStr) + 1) / 5);
        Command.BanMoves.MoveStr = LineStr;
        return e_CommBanMoves;

        // 5. "go [ponder] {infinite | depth <depth> | time <time> [movestogo <moves_to_go> | increment <inc_time>]}"指令
    } else if (strncmp(LineStr, "go ", 3) == 0) {
        LineStr += 3;
        // 首先判断到底是"go"还是"go ponder"，因为两者解释成不同的指令
        if (strncmp(LineStr, "ponder ", 7) == 0) {
            LineStr += 7;
            RetValue = e_CommGoPonder;
        } else {
            RetValue = e_CommGo;
        }
        // 然后判断到底是固定深度还是设定时限
        if (strncmp(LineStr, "time ", 5) == 0) {
            LineStr += 5;
            Command.Search.DepthTime.Time = ReadDigit(LineStr, 36000);
            // 如果是设定时限，就要判断是时段制还是加时制
            if (strncmp(LineStr, " movestogo ", 11) == 0) {
                LineStr += 11;
                Command.Search.Mode = e_TimeMove;
                Command.Search.TimeMode.MovesToGo = ReadDigit(LineStr, 100);
                if (Command.Search.TimeMode.MovesToGo < 1) {
                    Command.Search.TimeMode.MovesToGo = 1;
                }
            } else if (strncmp(LineStr, " increment ", 11) == 0) {
                LineStr += 11;
                Command.Search.Mode = e_TimeInc;
                Command.Search.TimeMode.Increment = ReadDigit(LineStr, 600);
                // 如果没有说明是时段制还是加时制，就设定为步数是1的时段制
            } else {
                Command.Search.Mode = e_TimeMove;
                Command.Search.TimeMode.MovesToGo = 1;
            }
        } else if (strncmp(LineStr, "depth ", 6) == 0) {
            LineStr += 6;
            Command.Search.Mode = e_TimeDepth;
            Command.Search.DepthTime.Depth = ReadDigit(LineStr, c_MaxDepth - 1);
            // 如果没有说明是固定深度还是设定时限，就固定深度为"c_MaxDepth"
        } else {
            Command.Search.Mode = e_TimeDepth;
            Command.Search.DepthTime.Depth = c_MaxDepth - 1;
        }
        return RetValue;

        // 5. "stop"指令
    } else if (strcmp(LineStr, "stop") == 0) {
        return e_CommStop;

        // 6. "quit"指令
    } else if (strcmp(LineStr, "quit") == 0) {
        return e_CommQuit;

        // 7. 重要信息
    } else if (strncmp(LineStr, "//", 2) == 0) {
    	Command.Annotation.String = LineStr;
    	return e_CommAnnotation;

    	// 8. 无法识别的指令
    } else {
        return e_CommNone;
    }
}